

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O2

void __thiscall sznet::net::TcpClient::newConnection(TcpClient *this,sz_sock sockfd)

{
  uint id;
  undefined1 auVar1 [8];
  TcpConnection *this_00;
  char local_108 [8];
  char buf [32];
  _Bind<void_(sznet::net::TcpClient::*(sznet::net::TcpClient_*,_std::_Placeholder<1>))(const_std::shared_ptr<sznet::net::TcpConnection>_&)>
  local_e0;
  sockaddr_in6 local_c4;
  undefined1 local_a8 [8];
  InetAddress localAddr;
  undefined1 local_80 [8];
  string connName;
  MutexLockGuard lock;
  undefined1 local_40 [8];
  TcpConnectionPtr conn;
  
  EventLoop::assertInLoopThread(this->m_loop);
  sockets::sz_sock_getpeeraddr(&local_c4,sockfd);
  id = this->m_nextConnId;
  this->m_nextConnId = id + 1;
  InetAddress::toIpPort_abi_cxx11_((string *)local_80,(InetAddress *)&local_c4);
  snprintf(local_108,0x20,":%s#%d",local_80,(ulong)id);
  std::__cxx11::string::~string((string *)local_80);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 &this->m_name,local_108);
  sockets::sz_sock_getlocaladdr((sockaddr_in6 *)((long)&connName.field_2 + 8),sockfd);
  local_a8 = (undefined1  [8])connName.field_2._8_8_;
  this_00 = (TcpConnection *)operator_new(0x1d0);
  TcpConnection::TcpConnection
            (this_00,this->m_loop,(string *)local_80,id,sockfd,(InetAddress *)local_a8,
             (InetAddress *)&local_c4);
  std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<sznet::net::TcpConnection,void>
            ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)local_40,this_00)
  ;
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator=
            ((ConnectionCallback *)((long)local_40 + 0x90),&this->m_connectionCallback);
  std::
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
  ::operator=((MessageCallback *)((long)local_40 + 0xb0),&this->m_messageCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator=
            ((WriteCompleteCallback *)((long)local_40 + 0xd0),&this->m_writeCompleteCallback);
  auVar1 = local_40;
  local_e0._M_f = (offset_in_TcpClient_to_subr)removeConnection;
  local_e0._8_8_ = 0;
  local_e0._M_bound_args.super__Tuple_impl<0UL,_sznet::net::TcpClient_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_sznet::net::TcpClient_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_sznet::net::TcpClient_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_sznet::net::TcpClient_*,_std::_Placeholder<1>_>)this;
  std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>::
  function<std::_Bind<void(sznet::net::TcpClient::*(sznet::net::TcpClient*,std::_Placeholder<1>))(std::shared_ptr<sznet::net::TcpConnection>const&)>,void>
            ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&)> *)
             (connName.field_2._M_local_buf + 8),&local_e0);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator=
            ((CloseCallback *)((long)auVar1 + 0x110),
             (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)
             ((long)&connName.field_2 + 8));
  std::_Function_base::~_Function_base((_Function_base *)((long)&connName.field_2 + 8));
  connName.field_2._8_8_ = &this->m_mutex;
  MutexLock::lock((MutexLock *)connName.field_2._8_8_);
  std::__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_connection).
              super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)local_40);
  MutexLockGuard::~MutexLockGuard((MutexLockGuard *)((long)&connName.field_2 + 8));
  TcpConnection::connectEstablished((TcpConnection *)local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&conn);
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

void TcpClient::newConnection(sockets::sz_sock sockfd)
{
	m_loop->assertInLoopThread();
	InetAddress peerAddr(sockets::sz_sock_getpeeraddr(sockfd));
	char buf[32];
	uint32_t connId = m_nextConnId++;
	snprintf(buf, sizeof(buf), ":%s#%d", peerAddr.toIpPort().c_str(), connId);
	string connName = m_name + buf;

	InetAddress localAddr(sockets::sz_sock_getlocaladdr(sockfd));
	// FIXME poll with zero timeout to double confirm the new connection
	// FIXME use make_shared if necessary
	TcpConnectionPtr conn(new TcpConnection(m_loop, connName, connId, sockfd, localAddr, peerAddr));
	conn->setConnectionCallback(m_connectionCallback);
	conn->setMessageCallback(m_messageCallback);
	conn->setWriteCompleteCallback(m_writeCompleteCallback);
	// FIXME: unsafe
	conn->setCloseCallback(std::bind(&TcpClient::removeConnection, this, std::placeholders::_1));
	// ��������ͬʱ��д����race condition
	{
		MutexLockGuard lock(m_mutex);
		m_connection = conn;
	}
	conn->connectEstablished();
}